

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall iu_Matcher_x_iutest_x_Optional_Test::Body(iu_Matcher_x_iutest_x_Optional_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  iu_global_format_stringstream strm;
  detail *local_3d0;
  long local_3c0 [2];
  string local_3b0;
  AssertionResult local_390;
  AssertionHelper local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [112];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  local_1b0._0_4_ = 1;
  pcVar2 = local_328 + 0x10;
  local_338._0_8_ = &PTR__OptionalMatcher_002427e0;
  local_328._8_8_ = 0;
  local_328[0x10] = '\0';
  local_338._8_8_ = (IsNullMatcher *)local_1b0;
  local_328._0_8_ = pcVar2;
  iutest::detail::OptionalMatcher<int>::operator()
            (&local_390,(OptionalMatcher<int> *)local_338,&opt1);
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
  }
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::iuUniversalPrinter<std::optional<int>_>::Print(&opt1,(iu_ostream *)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Optional(1)",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x355;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  paVar1 = &local_390.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
  local_1b0._0_8_ = &PTR__IMatcher_0023f1d0;
  local_338._0_8_ = &PTR__OptionalMatcher_00242820;
  local_328._8_8_ = 0;
  local_328[0x10] = '\0';
  local_338._8_8_ = (IsNullMatcher *)local_1b0;
  local_328._0_8_ = pcVar2;
  local_1b0._8_8_ = &local_368;
  iutest::detail::OptionalMatcher<iutest::detail::EqMatcher<int>>::operator()
            (&local_390,(OptionalMatcher<iutest::detail::EqMatcher<int>> *)local_338,&opt1);
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
  }
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::iuUniversalPrinter<std::optional<int>_>::Print(&opt1,(iu_ostream *)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Optional(Eq(1))",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x356;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 2;
  local_1b0._0_8_ = &PTR__IMatcher_0023f750;
  local_338._0_8_ = &PTR__OptionalMatcher_00242860;
  local_328._8_8_ = 0;
  local_328[0x10] = '\0';
  local_338._8_8_ = (IsNullMatcher *)local_1b0;
  local_328._0_8_ = pcVar2;
  local_1b0._8_8_ = &local_368;
  iutest::detail::OptionalMatcher<iutest::detail::LtMatcher<int>>::operator()
            (&local_390,(OptionalMatcher<iutest::detail::LtMatcher<int>> *)local_338,&opt1);
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
  }
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::iuUniversalPrinter<std::optional<int>_>::Print(&opt1,(iu_ostream *)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Optional(Lt(2))",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x357;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1b0._0_8_ = &PTR__IMatcher_0023eaf8;
  local_338._0_8_ = &PTR__OptionalMatcher_002428a0;
  local_328._8_8_ = 0;
  local_328[0x10] = '\0';
  local_338._8_8_ = (IsNullMatcher *)local_1b0;
  local_328._0_8_ = pcVar2;
  iutest::detail::OptionalMatcher<iutest::detail::IsNullMatcher>::operator()
            (&local_390,(OptionalMatcher<iutest::detail::IsNullMatcher> *)local_338,&optnull);
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
  }
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::
    iuUniversalPrinter<std::optional<std::unique_ptr<int,_std::default_delete<int>_>_>_>::Print
              (&optnull,(iu_ostream *)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Optional(IsNull())",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x359;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(Matcher, Optional)
{
    IUTEST_EXPECT_THAT(opt1, Optional(1));
    IUTEST_EXPECT_THAT(opt1, Optional(Eq(1)));
    IUTEST_EXPECT_THAT(opt1, Optional(Lt(2)));

    IUTEST_EXPECT_THAT(optnull, Optional(IsNull()));
}